

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

void art_replace(art_inner_node_t *node,art_key_chunk_t key_chunk,art_node_t *new_child)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  switch(node->typecode) {
  case '\0':
    if ((ulong)node[1].typecode != 0) {
      puVar1 = node[2].prefix;
      uVar2 = 0;
      do {
        if (node[1].prefix[uVar2 - 1] == key_chunk) goto LAB_00113c3a;
        uVar2 = uVar2 + 1;
        puVar1 = puVar1 + 8;
      } while (node[1].typecode != uVar2);
    }
    break;
  case '\x01':
    if ((ulong)node[1].typecode != 0) {
      puVar1 = node[3].prefix + 1;
      uVar2 = 0;
      do {
        if (node[1].prefix[uVar2 - 1] == key_chunk) goto LAB_00113c3a;
        uVar2 = uVar2 + 1;
        puVar1 = puVar1 + 8;
      } while (node[1].typecode != uVar2);
    }
    break;
  case '\x02':
    puVar1 = (uint8_t *)((long)node + (ulong)node[2].prefix[key_chunk] * 8 + 0x110);
    goto LAB_00113c3a;
  case '\x03':
    puVar1 = (uint8_t *)((long)node + (ulong)key_chunk * 8 + 0x10);
LAB_00113c3a:
    *(art_node_t **)puVar1 = new_child;
    return;
  }
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_key_chunk_t key_chunk,
                        art_node_t *new_child) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}